

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

void __thiscall
gmath::RationalTangentialDistortion::getProperties
          (RationalTangentialDistortion *this,Properties *prop,int id)

{
  undefined8 in_RSI;
  char *in_RDI;
  double *unaff_retaddr;
  char *in_stack_00000008;
  Properties *in_stack_00000010;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [48];
  string local_38 [44];
  int id_00;
  
  id_00 = (int)((ulong)in_RSI >> 0x20);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_RDI,id_00);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::__cxx11::string::~string(local_38);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_RDI,id_00);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::__cxx11::string::~string(local_68);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_RDI,id_00);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::__cxx11::string::~string(local_88);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_RDI,id_00);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::__cxx11::string::~string(local_a8);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_RDI,id_00);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::__cxx11::string::~string(local_c8);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_RDI,id_00);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::__cxx11::string::~string(local_e8);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_RDI,id_00);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::__cxx11::string::~string(local_108);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_RDI,id_00);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::__cxx11::string::~string(local_128);
  return;
}

Assistant:

void RationalTangentialDistortion::getProperties(gutil::Properties &prop, int id) const
{
  prop.putValue(getCameraKey("p1", id).c_str(), kd[0]);
  prop.putValue(getCameraKey("p2", id).c_str(), kd[1]);

  prop.putValue(getCameraKey("k1", id).c_str(), kd[2]);
  prop.putValue(getCameraKey("k2", id).c_str(), kd[3]);
  prop.putValue(getCameraKey("k3", id).c_str(), kd[4]);
  prop.putValue(getCameraKey("k4", id).c_str(), kd[5]);
  prop.putValue(getCameraKey("k5", id).c_str(), kd[6]);
  prop.putValue(getCameraKey("k6", id).c_str(), kd[7]);
}